

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O1

void __thiscall embree::ISPCQuadMesh::~ISPCQuadMesh(ISPCQuadMesh *this)

{
  ulong uVar1;
  
  if (this->positions != (Vec3fa **)0x0) {
    if (this->numTimeSteps != 0) {
      uVar1 = 0;
      do {
        alignedUSMFree(this->positions[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->numTimeSteps);
    }
    alignedUSMFree(this->positions);
  }
  if (this->normals != (Vec3fa **)0x0) {
    if (this->numTimeSteps != 0) {
      uVar1 = 0;
      do {
        alignedUSMFree(this->normals[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->numTimeSteps);
    }
    alignedUSMFree(this->normals);
  }
  alignedUSMFree(this->texcoords);
  alignedUSMFree(this->quads);
  ISPCGeometry::~ISPCGeometry(&this->geom);
  return;
}

Assistant:

ISPCQuadMesh::~ISPCQuadMesh ()
  {
    if (positions) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(positions[i]);
      alignedUSMFree(positions);
    }
    
    if (normals) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(normals[i]);
      alignedUSMFree(normals);
    }

    alignedUSMFree(texcoords);
    alignedUSMFree(quads);
  }